

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

void __thiscall
nonius::standard_reporter::do_params_start(standard_reporter *this,parameters *params)

{
  bool bVar1;
  ostream *poVar2;
  long in_RDI;
  
  if ((*(byte *)(in_RDI + 0x31) & 1) == 0) {
    bVar1 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
            ::empty((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
                     *)0x1ebb67);
    if (!bVar1) {
      poVar2 = reporter::report_stream((reporter *)0x1ebb74);
      std::operator<<(poVar2,"\n\nnew round for parameters\n");
      nonius::operator<<((ostream *)this,params);
    }
  }
  return;
}

Assistant:

void do_params_start(parameters const& params) override {
            if(!summary && !params.empty()) report_stream() << "\n\nnew round for parameters\n" << params;
        }